

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O3

string * __thiscall
flatbuffers::BaseGenerator::LastNamespacePart_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,Namespace *ns)

{
  Parser *pPVar1;
  _Base_ptr p_Var2;
  
  pPVar1 = this->parser_;
  if ((Parser *)this->_vptr_BaseGenerator == pPVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    p_Var2 = pPVar1[-1].string_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var2,
               (long)&p_Var2->_M_color +
               (long)&(pPVar1[-1].string_cache_._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_right)->_M_color);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::LastNamespacePart(const Namespace &ns) {
  if (!ns.components.empty())
    return ns.components.back();
  else
    return std::string("");
}